

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sweep.cc
# Opt level: O1

void __thiscall
p2t::Sweep::EdgeEvent
          (Sweep *this,SweepContext *tcx,Point *ep,Point *eq,Triangle *triangle,Point *point)

{
  bool bVar1;
  Point *pPVar2;
  Triangle *pTVar3;
  runtime_error *this_00;
  Triangle *this_01;
  double dVar4;
  double dVar5;
  
  this_01 = (Triangle *)this;
  while( true ) {
    bVar1 = IsEdgeSideOfTriangle((Sweep *)this_01,triangle,ep,eq);
    if (bVar1) {
      return;
    }
    pPVar2 = Triangle::PointCCW(triangle,point);
    dVar5 = (pPVar2->y - ep->y) * (eq->x - ep->x) - (pPVar2->x - ep->x) * (eq->y - ep->y);
    if (ABS(dVar5) < 1e-12) break;
    pPVar2 = Triangle::PointCW(triangle,point);
    dVar4 = (pPVar2->y - ep->y) * (eq->x - ep->x) - (pPVar2->x - ep->x) * (eq->y - ep->y);
    if (ABS(dVar4) < 1e-12) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_00,"EdgeEvent - collinear points not supported");
      goto LAB_006fb113;
    }
    if (0.0 < dVar5 != 0.0 < dVar4) {
      FlipEdgeEvent(this,tcx,ep,eq,triangle,point);
      return;
    }
    if (0.0 < dVar5) {
      pTVar3 = Triangle::NeighborCW(triangle,point);
      this_01 = triangle;
      triangle = pTVar3;
    }
    else {
      pTVar3 = Triangle::NeighborCCW(triangle,point);
      this_01 = triangle;
      triangle = pTVar3;
    }
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"EdgeEvent - collinear points not supported");
LAB_006fb113:
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void Sweep::EdgeEvent(SweepContext& tcx, Point& ep, Point& eq, Triangle* triangle, Point& point)
{
  if (IsEdgeSideOfTriangle(*triangle, ep, eq)) {
    return;
  }

  Point* p1 = triangle->PointCCW(point);
  Orientation o1 = Orient2d(eq, *p1, ep);
  if (o1 == COLLINEAR) {
	  // ASSIMP_CHANGE (aramis_acg)
	  throw std::runtime_error("EdgeEvent - collinear points not supported");
    if( triangle->Contains(&eq, p1)) {
      triangle->MarkConstrainedEdge(&eq, p1 );
      // We are modifying the constraint maybe it would be better to
      // not change the given constraint and just keep a variable for the new constraint
      tcx.edge_event.constrained_edge->q = p1;
      triangle = &triangle->NeighborAcross(point);
      EdgeEvent( tcx, ep, *p1, triangle, *p1 );
    } else {
	  // ASSIMP_CHANGE (aramis_acg)
      std::runtime_error("EdgeEvent - collinear points not supported");
    }
    return;
  }

  Point* p2 = triangle->PointCW(point);
  Orientation o2 = Orient2d(eq, *p2, ep);
  if (o2 == COLLINEAR) {
	  // ASSIMP_CHANGE (aramis_acg)
	  throw std::runtime_error("EdgeEvent - collinear points not supported");

    if( triangle->Contains(&eq, p2)) {
      triangle->MarkConstrainedEdge(&eq, p2 );
      // We are modifying the constraint maybe it would be better to
      // not change the given constraint and just keep a variable for the new constraint
      tcx.edge_event.constrained_edge->q = p2;
      triangle = &triangle->NeighborAcross(point);
      EdgeEvent( tcx, ep, *p2, triangle, *p2 );
    } else {
      // ASSIMP_CHANGE (aramis_acg)
      throw std::runtime_error("EdgeEvent - collinear points not supported");
    }
    return;
  }

  if (o1 == o2) {
    // Need to decide if we are rotating CW or CCW to get to a triangle
    // that will cross edge
    if (o1 == CW) {
      triangle = triangle->NeighborCCW(point);
    }       else{
      triangle = triangle->NeighborCW(point);
    }
    EdgeEvent(tcx, ep, eq, triangle, point);
  } else {
    // This triangle crosses constraint so lets flippin start!
    FlipEdgeEvent(tcx, ep, eq, triangle, point);
  }
}